

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O2

bool __thiscall
SphereTriangleDetector::collide
          (SphereTriangleDetector *this,btVector3 *sphereCenter,btVector3 *point,
          btVector3 *resultNormal,btScalar *depth,btScalar *timeOfImpact,
          btScalar contactBreakingThreshold)

{
  btVector3 *v2;
  btTriangleShape *pbVar1;
  btScalar *pbVar2;
  bool bVar3;
  int iVar4;
  int i;
  float fVar5;
  float fVar6;
  btScalar bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  btVector3 bVar11;
  btVector3 nearestOnEdge;
  btVector3 pb;
  btVector3 pa;
  btVector3 local_b8;
  btVector3 local_a8;
  btVector3 *local_98;
  btScalar *local_90;
  btVector3 local_88;
  undefined8 local_78;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  btVector3 local_50;
  btVector3 local_40;
  
  pbVar1 = this->m_triangle;
  v2 = pbVar1->m_vertices1;
  uVar8 = 0;
  uVar9 = 0;
  fVar5 = (this->m_sphere->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[0] *
          *(float *)&(this->m_sphere->super_btConvexInternalShape).super_btConvexShape.
                     super_btCollisionShape.field_0x1c;
  local_68 = ZEXT416((uint)fVar5);
  fVar5 = contactBreakingThreshold + fVar5;
  local_98 = resultNormal;
  local_90 = depth;
  local_a8 = operator-(pbVar1->m_vertices1 + 1,v2);
  local_88 = operator-(pbVar1->m_vertices1 + 2,v2);
  local_b8 = btVector3::cross(&local_a8,&local_88);
  btVector3::normalize(&local_b8);
  bVar11 = operator-(sphereCenter,v2);
  bVar7 = bVar11.m_floats[3];
  fVar6 = bVar11.m_floats[2] * local_b8.m_floats[2] +
          bVar11.m_floats[0] * local_b8.m_floats[0] + bVar11.m_floats[1] * local_b8.m_floats[1];
  if (fVar6 < 0.0) {
    fVar6 = -fVar6;
    bVar7 = -bVar7;
    uVar8 = uVar8 ^ 0x80000000;
    uVar9 = uVar9 ^ 0x80000000;
    uVar10 = local_b8.m_floats._0_8_ ^ 0x8000000080000000;
    local_b8.m_floats[2] = -local_b8.m_floats[2];
    local_b8.m_floats[0] = (btScalar)(int)uVar10;
    local_b8.m_floats[1] = (btScalar)(int)(uVar10 >> 0x20);
  }
  if (fVar6 < fVar5) {
    local_78 = (btVector3 *)CONCAT44(bVar7,fVar6);
    uStack_70 = uVar8;
    uStack_6c = uVar9;
    bVar3 = facecontains(this,sphereCenter,v2,&local_b8);
    if (bVar3) {
      local_88.m_floats[1] = (float)local_78 * local_b8.m_floats[1];
      local_88.m_floats[0] = (float)local_78 * local_b8.m_floats[0];
      local_88.m_floats[2] = (float)local_78 * local_b8.m_floats[2];
      local_88.m_floats[3] = 0.0;
      local_a8 = operator-(sphereCenter,&local_88);
    }
    else {
      bVar3 = false;
      local_78 = point;
      for (uVar8 = 0;
          iVar4 = (*(this->m_triangle->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                    super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x19])(),
          (int)uVar8 < iVar4; uVar8 = uVar8 + 1) {
        (*(this->m_triangle->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x1a])
                  (this->m_triangle,(ulong)uVar8,&local_40,&local_50);
        bVar7 = SegmentSqrDistance(&local_40,&local_50,sphereCenter,&local_88);
        if (bVar7 < fVar5 * fVar5) {
          local_a8.m_floats[0] = local_88.m_floats[0];
          local_a8.m_floats[1] = local_88.m_floats[1];
          local_a8.m_floats[2] = local_88.m_floats[2];
          local_a8.m_floats[3] = local_88.m_floats[3];
          bVar3 = true;
        }
      }
      point = local_78;
      if (!bVar3) {
        return false;
      }
    }
    pbVar2 = local_90;
    local_88 = operator-(sphereCenter,&local_a8);
    bVar7 = btVector3::length2(&local_88);
    if (bVar7 < fVar5 * fVar5) {
      if (bVar7 <= 1.1920929e-07) {
        *(undefined8 *)local_98->m_floats = local_b8.m_floats._0_8_;
        *(undefined8 *)(local_98->m_floats + 2) = local_b8.m_floats._8_8_;
        *(undefined8 *)point->m_floats = local_a8.m_floats._0_8_;
        *(undefined8 *)(point->m_floats + 2) = local_a8.m_floats._8_8_;
      }
      else {
        if (bVar7 < 0.0) {
          fVar5 = sqrtf(bVar7);
        }
        else {
          fVar5 = SQRT(bVar7);
        }
        *(undefined8 *)local_98->m_floats = local_88.m_floats._0_8_;
        *(undefined8 *)(local_98->m_floats + 2) = local_88.m_floats._8_8_;
        btVector3::normalize(local_98);
        *(undefined8 *)point->m_floats = local_a8.m_floats._0_8_;
        *(undefined8 *)(point->m_floats + 2) = local_a8.m_floats._8_8_;
        local_68._0_4_ = (float)local_68._0_4_ - fVar5;
      }
      *pbVar2 = -(float)local_68._0_4_;
      return true;
    }
  }
  return false;
}

Assistant:

bool SphereTriangleDetector::collide(const btVector3& sphereCenter,btVector3 &point, btVector3& resultNormal, btScalar& depth, btScalar &timeOfImpact, btScalar contactBreakingThreshold)
{

	const btVector3* vertices = &m_triangle->getVertexPtr(0);
	
	btScalar radius = m_sphere->getRadius();
	btScalar radiusWithThreshold = radius + contactBreakingThreshold;

	btVector3 normal = (vertices[1]-vertices[0]).cross(vertices[2]-vertices[0]);
	normal.normalize();
	btVector3 p1ToCentre = sphereCenter - vertices[0];
	btScalar distanceFromPlane = p1ToCentre.dot(normal);

	if (distanceFromPlane < btScalar(0.))
	{
		//triangle facing the other way
		distanceFromPlane *= btScalar(-1.);
		normal *= btScalar(-1.);
	}

	bool isInsideContactPlane = distanceFromPlane < radiusWithThreshold;
	
	// Check for contact / intersection
	bool hasContact = false;
	btVector3 contactPoint;
	if (isInsideContactPlane) {
		if (facecontains(sphereCenter,vertices,normal)) {
			// Inside the contact wedge - touches a point on the shell plane
			hasContact = true;
			contactPoint = sphereCenter - normal*distanceFromPlane;
		} else {
			// Could be inside one of the contact capsules
			btScalar contactCapsuleRadiusSqr = radiusWithThreshold*radiusWithThreshold;
			btVector3 nearestOnEdge;
			for (int i = 0; i < m_triangle->getNumEdges(); i++) {
				
				btVector3 pa;
				btVector3 pb;
				
				m_triangle->getEdge(i,pa,pb);

				btScalar distanceSqr = SegmentSqrDistance(pa,pb,sphereCenter, nearestOnEdge);
				if (distanceSqr < contactCapsuleRadiusSqr) {
					// Yep, we're inside a capsule
					hasContact = true;
					contactPoint = nearestOnEdge;
				}
				
			}
		}
	}

	if (hasContact) {
		btVector3 contactToCentre = sphereCenter - contactPoint;
		btScalar distanceSqr = contactToCentre.length2();

		if (distanceSqr < radiusWithThreshold*radiusWithThreshold)
		{
			if (distanceSqr>SIMD_EPSILON)
			{
				btScalar distance = btSqrt(distanceSqr);
				resultNormal = contactToCentre;
				resultNormal.normalize();
				point = contactPoint;
				depth = -(radius-distance);
			} else
			{
				resultNormal = normal;
				point = contactPoint;
				depth = -radius;
			}
			return true;
		}
	}
	
	return false;
}